

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O3

void MWT::value_policy(mwt *c,float val,uint64_t index)

{
  vw *pvVar1;
  uint64_t *puVar2;
  ostream *poVar3;
  policy_data *ppVar4;
  uint32_t *puVar5;
  float fVar6;
  uint64_t new_index;
  ulong local_20;
  
  fVar6 = floorf(val);
  if (0.0 <= val) {
    if ((fVar6 == val) && (!NAN(fVar6) && !NAN(val))) goto LAB_001906cf;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"error ",6);
  poVar3 = std::ostream::_M_insert<double>((double)val);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," is not a valid action ",0x17);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
LAB_001906cf:
  pvVar1 = c->all;
  puVar5 = &(pvVar1->weights).dense_weights._stride_shift;
  puVar2 = &(pvVar1->weights).dense_weights._weight_mask;
  if ((pvVar1->weights).sparse != false) {
    puVar5 = &(pvVar1->weights).sparse_weights._stride_shift;
    puVar2 = &(pvVar1->weights).sparse_weights._weight_mask;
  }
  local_20 = (index & *puVar2) >> ((byte)*puVar5 & 0x3f);
  ppVar4 = (c->evals)._begin;
  if (ppVar4[local_20].seen == false) {
    ppVar4[local_20].seen = true;
    v_array<unsigned_long>::push_back(&c->policies,&local_20);
    ppVar4 = (c->evals)._begin;
  }
  ppVar4[local_20].action = (uint32_t)(long)val;
  return;
}

Assistant:

void value_policy(mwt& c, float val, uint64_t index)  // estimate the value of a single feature.
{
  if (val < 0 || floor(val) != val)
    cout << "error " << val << " is not a valid action " << endl;

  uint32_t value = (uint32_t)val;
  uint64_t new_index = (index & c.all->weights.mask()) >> c.all->weights.stride_shift();

  if (!c.evals[new_index].seen)
  {
    c.evals[new_index].seen = true;
    c.policies.push_back(new_index);
  }

  c.evals[new_index].action = value;
}